

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal.cpp
# Opt level: O3

Am_Drawonable * get_safe_drawonable(Am_Object *screen)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Drawonable *pAVar3;
  Am_Object used_screen;
  Am_Object local_10;
  
  local_10.data = (Am_Object_Data *)0x0;
  bVar1 = Am_Object::Valid(screen);
  if (!bVar1) {
    screen = &Am_Screen;
  }
  Am_Object::operator=(&local_10,screen);
  pAVar2 = Am_Object::Get(&local_10,0x7d2,4);
  pAVar3 = (Am_Drawonable *)Am_Value::operator_cast_to_void_(pAVar2);
  if (pAVar3 == (Am_Drawonable *)0x0) {
    pAVar2 = Am_Object::Get(&Am_Screen,0x7d2,4);
    pAVar3 = (Am_Drawonable *)Am_Value::operator_cast_to_void_(pAVar2);
  }
  Am_Object::~Am_Object(&local_10);
  return pAVar3;
}

Assistant:

static Am_Drawonable *
get_safe_drawonable(const Am_Object &screen)
{
  Am_Object used_screen;
  if (screen.Valid())
    used_screen = screen;
  else
    used_screen = Am_Screen;

  Am_Drawonable *drawonable =
      Am_Drawonable::Narrow(used_screen.Get(Am_DRAWONABLE, Am_NO_DEPENDENCY));
  if (!drawonable)
    drawonable =
        Am_Drawonable::Narrow(Am_Screen.Get(Am_DRAWONABLE, Am_NO_DEPENDENCY));
  return drawonable;
}